

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObjectPropertyEnumerator.cpp
# Opt level: O2

void __thiscall
Js::DynamicObjectPropertyEnumerator::Initialize
          (DynamicObjectPropertyEnumerator *this,DynamicType *type,CachedData *data,
          BigPropertyIndex initialPropertyCount)

{
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierSet(&this->initialType,type);
  Memory::WriteBarrierPtr<Js::DynamicObjectPropertyEnumerator::CachedData>::WriteBarrierSet
            (&this->cachedData,data);
  this->initialPropertyCount = initialPropertyCount;
  return;
}

Assistant:

void DynamicObjectPropertyEnumerator::Initialize(DynamicType * type, CachedData * data, Js::BigPropertyIndex initialPropertyCount)
    {
        this->initialType = type;
        this->cachedData = data;
        this->initialPropertyCount = initialPropertyCount;
    }